

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::clear_echo(Snes_Spc *this)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  Spc_Dsp *in_RDI;
  int end;
  int addr;
  int local_10;
  
  uVar2 = Spc_Dsp::read(in_RDI,0x6c,in_RDX,in_RCX);
  if ((uVar2 & 0x20) == 0) {
    sVar3 = Spc_Dsp::read(in_RDI,0x6d,__buf,in_RCX);
    iVar1 = (int)sVar3 * 0x100;
    sVar4 = Spc_Dsp::read(in_RDI,0x7d,__buf_00,in_RCX);
    local_10 = iVar1 + ((uint)sVar4 & 0xf) * 0x800;
    if (0x10000 < local_10) {
      local_10 = 0x10000;
    }
    memset((void *)((long)in_RDI[1].m.voices[5].buf + (long)iVar1 + 0x5c),0xff,
           (long)(local_10 + (int)sVar3 * -0x100));
  }
  return;
}

Assistant:

void Snes_Spc::clear_echo()
{
	if ( !(dsp.read( Spc_Dsp::r_flg ) & 0x20) )
	{
		int addr = 0x100 * dsp.read( Spc_Dsp::r_esa );
		int end  = addr + 0x800 * (dsp.read( Spc_Dsp::r_edl ) & 0x0F);
		if ( end > 0x10000 )
			end = 0x10000;
		memset( &RAM [addr], 0xFF, end - addr );
	}
}